

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

RPCHelpMan * scanblocks(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  long *plVar4;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string cond;
  string m_key_name_04;
  string m_key_name_05;
  string cond_00;
  string name_04;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string m_key_name_06;
  string description_04;
  string description_05;
  string m_key_name_07;
  string description_06;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_07;
  string description_08;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  RPCExamples examples;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_08;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  string *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long *plVar6;
  undefined8 uVar7;
  RPCHelpMan *in_RDI;
  long lVar8;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  undefined8 in_stack_ffffffffffffe598;
  undefined1 *puVar9;
  undefined1 in_stack_ffffffffffffe5a0 [16];
  undefined8 in_stack_ffffffffffffe5b8;
  undefined8 in_stack_ffffffffffffe5c0;
  undefined8 in_stack_ffffffffffffe5c8;
  code *pcVar10;
  undefined8 in_stack_ffffffffffffe5d0;
  undefined1 in_stack_ffffffffffffe5d8 [16];
  pointer in_stack_ffffffffffffe5e8;
  pointer pRVar11;
  pointer in_stack_ffffffffffffe5f0;
  pointer pRVar12;
  pointer in_stack_ffffffffffffe5f8;
  pointer pRVar13;
  pointer in_stack_ffffffffffffe600;
  pointer in_stack_ffffffffffffe608;
  pointer pRVar14;
  pointer in_stack_ffffffffffffe610;
  pointer pRVar15;
  pointer in_stack_ffffffffffffe618;
  pointer pRVar16;
  undefined8 in_stack_ffffffffffffe620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffe628;
  undefined1 in_stack_ffffffffffffe638 [16];
  pointer in_stack_ffffffffffffe648;
  pointer in_stack_ffffffffffffe650;
  pointer in_stack_ffffffffffffe658;
  undefined8 in_stack_ffffffffffffe660;
  pointer in_stack_ffffffffffffe668;
  pointer in_stack_ffffffffffffe670;
  pointer in_stack_ffffffffffffe678;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1980;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1968;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1948;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1928;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1910;
  allocator_type local_18f3;
  allocator_type local_18f2;
  bool local_18f1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_18f0;
  int local_18d4;
  vector<RPCArg,_std::allocator<RPCArg>_> local_18d0;
  string local_18b8;
  string local_1898;
  string local_1878;
  string local_1858;
  string local_1838;
  string local_1818;
  string local_17f8;
  string local_17d8;
  string local_17b8;
  string local_1798;
  string local_1778;
  string local_1758;
  string local_1738;
  string local_1718;
  string local_16f8;
  string local_16d8;
  string local_16b8;
  string local_1698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1618;
  ulong *local_15f8;
  undefined8 local_15f0;
  ulong local_15e8;
  undefined8 uStack_15e0;
  ulong *local_15d8;
  size_type local_15d0;
  ulong local_15c8;
  undefined8 uStack_15c0;
  long *local_15b8 [2];
  long local_15a8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1598;
  long *local_1578 [2];
  long local_1568 [2];
  pointer local_1558 [2];
  undefined1 local_1548 [152];
  RPCResult local_14b0;
  long *local_1428 [2];
  long local_1418 [2];
  long *local_1408 [2];
  long local_13f8 [2];
  long *local_13e8 [2];
  long local_13d8 [2];
  long *local_13c8 [2];
  long local_13b8 [2];
  long *local_13a8 [2];
  long local_1398 [2];
  long *local_1388 [2];
  long local_1378 [2];
  long *local_1368 [2];
  long local_1358 [2];
  RPCResult local_1348;
  long *local_12c0 [2];
  long local_12b0 [2];
  long *local_12a0 [2];
  long local_1290 [2];
  long *local_1280 [2];
  long local_1270 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1260;
  long *local_1240 [2];
  long local_1230 [2];
  pointer local_1220 [2];
  undefined1 local_1210 [152];
  RPCResult local_1178;
  RPCResult local_10f0;
  RPCResult local_1068;
  vector<RPCResult,_std::allocator<RPCResult>_> local_fe0;
  long *local_fc0 [2];
  long local_fb0 [2];
  long *local_fa0 [2];
  long local_f90 [2];
  RPCResult local_f80;
  RPCResult local_ef8;
  RPCResult local_e70;
  RPCResult local_de8;
  undefined1 local_d60 [8];
  long *local_d58 [2];
  long local_d48 [2];
  undefined1 local_d38 [32];
  undefined1 local_d18;
  undefined1 *local_d10;
  undefined8 local_d08;
  undefined1 local_d00;
  undefined7 uStack_cff;
  undefined1 local_cf0 [32];
  long *local_cd0 [2];
  long local_cc0 [2];
  UniValue local_cb0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_c58;
  undefined1 local_c00;
  long *local_bf8 [2];
  long local_be8 [2];
  RPCArg local_bd8;
  long *local_ad0 [2];
  long local_ac0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ab0;
  undefined1 local_a58;
  long *local_a50 [2];
  long local_a40 [2];
  undefined1 local_a30;
  undefined1 *local_a28;
  undefined8 local_a20;
  undefined1 local_a18;
  undefined7 uStack_a17;
  undefined1 local_a08 [32];
  long *local_9e8 [2];
  long local_9d8 [2];
  UniValue local_9c8;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_970;
  undefined1 local_918;
  long *local_910 [2];
  long local_900 [2];
  undefined1 local_8f0;
  undefined1 *local_8e8;
  undefined8 local_8e0;
  undefined1 local_8d8;
  undefined7 uStack_8d7;
  undefined1 local_8c8 [32];
  long *local_8a8 [2];
  long local_898 [2];
  uint *local_888;
  undefined8 local_880;
  uint local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_868;
  undefined1 local_810;
  long *local_808 [2];
  long local_7f8 [2];
  undefined1 local_7e8;
  undefined1 *local_7e0;
  undefined8 local_7d8;
  undefined1 local_7d0;
  undefined7 uStack_7cf;
  undefined1 local_7c0 [32];
  long *local_7a0 [2];
  long local_790;
  undefined1 auStack_788 [8];
  undefined1 local_780 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_768;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_758;
  vector<UniValue,_std::allocator<UniValue>_> local_740;
  undefined1 local_728 [40];
  long local_700 [6];
  __index_type local_6d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c8;
  RPCArg local_6a8;
  RPCArg local_5a0;
  RPCArg local_498;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1068.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"scanblocks","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nReturn relevant blockhashes for given descriptors (requires blockfilterindex).\nThis call may take several minutes. Make sure to use no RPC timeout (bitcoin-cli -rpcclienttimeout=0)"
             ,"");
  RPCArg::RPCArg(&local_6a8,&scan_action_arg_desc);
  RPCArg::RPCArg(&local_5a0,&scan_objects_arg_desc);
  local_6c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_6c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"start_height","");
  local_18d4 = 0;
  UniValue::UniValue<int,_int,_true>((UniValue *)local_780,&local_18d4);
  local_728._8_8_ = local_728 + 0x18;
  local_728._0_4_ = local_780._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._8_8_ == &local_768) {
    local_728._32_8_ = local_768._8_8_;
  }
  else {
    local_728._8_8_ = local_780._8_8_;
  }
  local_728._16_8_ = local_780._16_8_;
  local_780._16_8_ = 0;
  local_768._M_local_buf[0] = '\0';
  local_700[0] = (long)local_758.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_700[1] = (long)local_758.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  local_700[2] = (long)local_758.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_758.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_758.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_758.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_700[3]._0_4_ =
       local_740.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_700[3]._4_4_ =
       local_740.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_700[4]._0_4_ =
       local_740.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_700[4]._4_4_ =
       local_740.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_700[5] = (long)local_740.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  local_740.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_740.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_740.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_6d0 = '\x02';
  local_7a0[0] = &local_790;
  local_780._8_8_ = &local_768;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a0,"Height to start to scan from","");
  local_7e0 = &local_7d0;
  local_7e8 = 0;
  local_7d8 = 0;
  local_7d0 = 0;
  local_7c0._0_8_ = (pointer)0x0;
  local_7c0._8_2_ = 0;
  local_7c0._10_6_ = 0;
  local_7c0._16_2_ = 0;
  local_7c0._18_8_ = 0;
  name._8_16_ = in_stack_ffffffffffffe5a0;
  name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe598;
  name.field_2._8_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe5c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe5b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe5c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe5d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe5d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe5e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe5f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe5f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe600;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe608;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe610;
  description_09._M_string_length = in_stack_ffffffffffffe620;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe618;
  description_09.field_2 = in_stack_ffffffffffffe628;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe648;
  opts.skip_type_check = (bool)in_stack_ffffffffffffe638[0];
  opts._1_7_ = in_stack_ffffffffffffe638._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe638._8_8_;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe650;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe658;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe660;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe668;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe670;
  opts._64_8_ = in_stack_ffffffffffffe678;
  RPCArg::RPCArg(&local_498,name,(Type)&local_6c8,fallback,description_09,opts);
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"stop_height","");
  local_888 = &local_878;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"chain tip","");
  local_868._0_8_ = (long)&local_868 + 0x10;
  if (local_888 == &local_878) {
    local_868._24_4_ = uStack_870;
    local_868._28_4_ = uStack_86c;
  }
  else {
    local_868._0_8_ = local_888;
  }
  local_868._8_8_ = local_880;
  local_880 = 0;
  local_878 = local_878 & 0xffffff00;
  local_810 = 1;
  local_8a8[0] = local_898;
  local_888 = &local_878;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"Height to stop to scan","");
  local_8e8 = &local_8d8;
  local_8f0 = 0;
  local_8e0 = 0;
  local_8d8 = 0;
  local_8c8._0_8_ = (pointer)0x0;
  local_8c8._8_2_ = 0;
  local_8c8._10_6_ = 0;
  local_8c8._16_2_ = 0;
  local_8c8._18_8_ = 0;
  name_00._8_16_ = in_stack_ffffffffffffe5a0;
  name_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe598;
  name_00.field_2._8_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe5c0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe5b8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe5c8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe5d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe5d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe5e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe5f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe5f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe600;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe608;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe610;
  description_10._M_string_length = in_stack_ffffffffffffe620;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe618;
  description_10.field_2 = in_stack_ffffffffffffe628;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe648;
  opts_00.skip_type_check = (bool)in_stack_ffffffffffffe638[0];
  opts_00._1_7_ = in_stack_ffffffffffffe638._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe638._8_8_;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe650;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe658;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe660;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe668;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe670;
  opts_00._64_8_ = in_stack_ffffffffffffe678;
  RPCArg::RPCArg(&local_390,name_00,(Type)local_808,fallback_00,description_10,opts_00);
  local_910[0] = local_900;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"filtertype","");
  val = BlockFilterTypeName_abi_cxx11_(BASIC);
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_9c8,val);
  paVar1 = &local_9c8.val.field_2;
  local_970._8_8_ = (long)&local_970 + 0x18;
  local_970._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_9c8.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8.val._M_dataplus._M_p == paVar1) {
    local_970._32_8_ = local_9c8.val.field_2._8_8_;
  }
  else {
    local_970._8_8_ = local_9c8.val._M_dataplus._M_p;
  }
  local_970._16_8_ = local_9c8.val._M_string_length;
  local_9c8.val._M_string_length = 0;
  local_9c8.val.field_2._M_local_buf[0] = '\0';
  local_970._40_8_ =
       local_9c8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_970._48_8_ =
       local_9c8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_970._56_8_ =
       local_9c8.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_9c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_970._64_4_ =
       local_9c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_970._68_4_ =
       local_9c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_970._72_4_ =
       local_9c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_970._76_4_ =
       local_9c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_970._80_8_ =
       local_9c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_9c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_9c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_918 = 2;
  local_9e8[0] = local_9d8;
  local_9c8.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9e8,"The type name of the filter","");
  local_a28 = &local_a18;
  local_a30 = 0;
  local_a20 = 0;
  local_a18 = 0;
  local_a08._0_8_ = (pointer)0x0;
  local_a08._8_2_ = 0;
  local_a08._10_6_ = 0;
  local_a08._16_2_ = 0;
  local_a08._18_8_ = 0;
  name_01._8_16_ = in_stack_ffffffffffffe5a0;
  name_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe598;
  name_01.field_2._8_8_ = in_RDI;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe5c0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe5b8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe5c8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe5d0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe5d8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe5e8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe5f0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe5f8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe600;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe608;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe610;
  description_11._M_string_length = in_stack_ffffffffffffe620;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe618;
  description_11.field_2 = in_stack_ffffffffffffe628;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe648;
  opts_01.skip_type_check = (bool)in_stack_ffffffffffffe638[0];
  opts_01._1_7_ = in_stack_ffffffffffffe638._1_7_;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe638._8_8_;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe650;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe658;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe660;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe668;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe670;
  opts_01._64_8_ = in_stack_ffffffffffffe678;
  RPCArg::RPCArg(&local_288,name_01,(Type)local_910,fallback_01,description_11,opts_01);
  local_a50[0] = local_a40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a50,"options","");
  local_ab0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_a58 = 0;
  local_ad0[0] = local_ac0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ad0,"");
  local_bf8[0] = local_be8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf8,"filter_false_positives","");
  local_18f1 = false;
  UniValue::UniValue<bool,_bool,_true>(&local_cb0,&local_18f1);
  paVar1 = &local_cb0.val.field_2;
  local_c58._8_8_ = (long)&local_c58 + 0x18;
  local_c58._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_cb0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0.val._M_dataplus._M_p == paVar1) {
    local_c58._32_8_ = local_cb0.val.field_2._8_8_;
  }
  else {
    local_c58._8_8_ = local_cb0.val._M_dataplus._M_p;
  }
  local_c58._16_8_ = local_cb0.val._M_string_length;
  local_cb0.val._M_string_length = 0;
  local_cb0.val.field_2._M_local_buf[0] = '\0';
  local_c58._40_8_ =
       local_cb0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c58._48_8_ =
       local_cb0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_c58._56_8_ =
       local_cb0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_cb0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_cb0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cb0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c58._64_4_ =
       local_cb0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_c58._68_4_ =
       local_cb0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_c58._72_4_ =
       local_cb0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_c58._76_4_ =
       local_cb0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_c58._80_8_ =
       local_cb0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_cb0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_cb0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cb0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c00 = 2;
  local_cd0[0] = local_cc0;
  local_cb0.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cd0,
             "Filter false positives (slower and may fail on pruned nodes). Otherwise they may occur at a rate of 1/M"
             ,"");
  local_d10 = &local_d00;
  local_d18 = 0;
  local_d08 = 0;
  local_d00 = 0;
  local_cf0._0_8_ = (pointer)0x0;
  local_cf0._8_2_ = 0;
  local_cf0._10_6_ = 0;
  local_cf0._16_2_ = 0;
  local_cf0._18_8_ = 0;
  name_02._8_16_ = in_stack_ffffffffffffe5a0;
  name_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe598;
  name_02.field_2._8_8_ = in_RDI;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe5c0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe5b8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe5c8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe5d0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe5d8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe5e8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe5f0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe5f8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe600;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe608;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe610;
  description_12._M_string_length = in_stack_ffffffffffffe620;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe618;
  description_12.field_2 = in_stack_ffffffffffffe628;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe648;
  opts_02.skip_type_check = (bool)in_stack_ffffffffffffe638[0];
  opts_02._1_7_ = in_stack_ffffffffffffe638._1_7_;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe638._8_8_;
  opts_02.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe650;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe658;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe660;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe668;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe670;
  opts_02._64_8_ = in_stack_ffffffffffffe678;
  RPCArg::RPCArg(&local_bd8,name_02,(Type)local_bf8,fallback_02,description_12,opts_02);
  __l._M_len = 1;
  __l._M_array = &local_bd8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_18f0,__l,&local_18f2);
  local_d60[0] = 0;
  local_d58[0] = local_d48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d58,"options","");
  puVar9 = local_d60;
  local_d38._16_2_ = 0;
  local_d38._18_8_ = 0;
  local_d38._0_8_ = (pointer)0x0;
  local_d38._8_2_ = 0;
  local_d38._10_6_ = 0;
  name_03._8_16_ = in_stack_ffffffffffffe5a0;
  name_03._M_dataplus._M_p = puVar9;
  name_03.field_2._8_8_ = in_RDI;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe5c0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe5b8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe5c8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe5d0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe5d8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe5e8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe5f0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe5f8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe600;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe608;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe610;
  description_13._M_string_length = in_stack_ffffffffffffe620;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe618;
  description_13.field_2 = in_stack_ffffffffffffe628;
  inner_08.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe648;
  inner_08.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe638._0_8_;
  inner_08.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe638._8_8_;
  RPCArg::RPCArg(&local_180,name_03,(Type)local_a50,fallback_03,description_13,inner_08,
                 (RPCArgOptions *)0x5);
  __l_00._M_len = 6;
  __l_00._M_array = &local_6a8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_18d0,__l_00,&local_18f3);
  RPCResult::RPCResult(&local_f80,&scan_result_status_none);
  local_fa0[0] = local_f90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fa0,"When action==\'start\'; only returns after scan completes","");
  local_fc0[0] = local_fb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fc0,"");
  local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"");
  local_1220[0] = (pointer)local_1210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1220,"from_height","");
  local_1240[0] = local_1230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1240,"The height we started the scan from","");
  local_1948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._8_16_ = in_stack_ffffffffffffe5a0;
  m_key_name._M_dataplus._M_p = puVar9;
  m_key_name.field_2._8_8_ = in_RDI;
  description._M_string_length = in_stack_ffffffffffffe5c0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5b8;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffe5c8;
  description.field_2._8_8_ = in_stack_ffffffffffffe5d0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe5e8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe5d8._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_1210 + 0x10),NUM,m_key_name,description,inner,SUB81(local_1220,0));
  local_1260.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1260.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1260,"to_height","");
  local_1280[0] = local_1270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1280,"The height we ended the scan at","");
  local_1968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._8_16_ = in_stack_ffffffffffffe5a0;
  m_key_name_00._M_dataplus._M_p = puVar9;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_00._M_string_length = in_stack_ffffffffffffe5c0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5b8;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe5c8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe5d0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5e8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5d8._8_8_;
  RPCResult::RPCResult(&local_1178,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_1260,0));
  local_12a0[0] = local_1290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12a0,"relevant_blocks","");
  local_12c0[0] = local_12b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12c0,"Blocks that may have matched a scanobject.","");
  local_1368[0] = local_1358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1368,"blockhash","");
  local_1388[0] = local_1378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1388,"A relevant blockhash","");
  m_key_name_01._8_16_ = in_stack_ffffffffffffe5a0;
  m_key_name_01._M_dataplus._M_p = puVar9;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_01._M_string_length = in_stack_ffffffffffffe5c0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5b8;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe5c8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe5d0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5e8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5d8._8_8_;
  RPCResult::RPCResult
            (&local_1348,STR_HEX,m_key_name_01,description_01,inner_01,SUB81(local_1368,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1348;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1980,__l_01,(allocator_type *)&stack0xffffffffffffe667);
  m_key_name_02._8_16_ = in_stack_ffffffffffffe5a0;
  m_key_name_02._M_dataplus._M_p = puVar9;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_02._M_string_length = in_stack_ffffffffffffe5c0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5b8;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe5c8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe5d0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5e8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5d8._8_8_;
  RPCResult::RPCResult(&local_10f0,ARR,m_key_name_02,description_02,inner_02,SUB81(local_12a0,0));
  local_13a8[0] = local_1398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a8,"completed","");
  local_13c8[0] = local_13b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13c8,"true if the scan process was not aborted","");
  m_key_name_03._8_16_ = in_stack_ffffffffffffe5a0;
  m_key_name_03._M_dataplus._M_p = puVar9;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_03._M_string_length = in_stack_ffffffffffffe5c0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5b8;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe5c8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe5d0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5e8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5d8._8_8_;
  RPCResult::RPCResult(&local_1068,BOOL,m_key_name_03,description_03,inner_03,SUB81(local_13a8,0));
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)(local_1210 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1928,__l_02,(allocator_type *)&stack0xffffffffffffe647);
  cond._8_16_ = in_stack_ffffffffffffe5a0;
  cond._M_dataplus._M_p = puVar9;
  cond.field_2._8_8_ = in_RDI;
  m_key_name_06._M_string_length = in_stack_ffffffffffffe5c0;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5b8;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe5c8;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffe5d0;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe5e8;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  description_07._M_string_length = in_stack_ffffffffffffe5d8._8_8_;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe5f0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe600;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe5f8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe608;
  RPCResult::RPCResult(&local_ef8,cond,(Type)local_fa0,m_key_name_06,description_07,inner_06);
  local_13e8[0] = local_13d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e8,"when action==\'status\' and a scan is currently in progress","");
  local_1408[0] = local_13f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"");
  local_1428[0] = local_1418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1428,"");
  local_1558[0] = (pointer)local_1548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"progress","");
  local_1578[0] = local_1568;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1578,"Approximate percent complete","");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  m_key_name_04._8_16_ = in_stack_ffffffffffffe5a0;
  m_key_name_04._M_dataplus._M_p = puVar9;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_04._M_string_length = in_stack_ffffffffffffe5c0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5b8;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe5c8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe5d0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe5e8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5d8._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_1548 + 0x10),NUM,m_key_name_04,description_04,inner_04,
             SUB81(local_1558,0));
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1598,"current_height","");
  local_15b8[0] = local_15a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15b8,"Height of the block currently being scanned","");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_05._8_16_ = in_stack_ffffffffffffe5a0;
  m_key_name_05._M_dataplus._M_p = puVar9;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_05._M_string_length = in_stack_ffffffffffffe5c0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5b8;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe5c8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe5d0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe5d8._8_8_;
  RPCResult::RPCResult(&local_14b0,NUM,m_key_name_05,description_05,inner_05,SUB81(&local_1598,0));
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)(local_1548 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe628,__l_03,
             (allocator_type *)&stack0xffffffffffffe5e7);
  cond_00._8_16_ = in_stack_ffffffffffffe5a0;
  cond_00._M_dataplus._M_p = puVar9;
  cond_00.field_2._8_8_ = in_RDI;
  m_key_name_07._M_string_length = in_stack_ffffffffffffe5c0;
  m_key_name_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5b8;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe5c8;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffe5d0;
  description_08.field_2._M_allocated_capacity = (size_type)pRVar11;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  description_08._M_string_length = in_stack_ffffffffffffe5d8._8_8_;
  description_08.field_2._8_8_ = pRVar12;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe600;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar13;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar14;
  RPCResult::RPCResult(&local_e70,cond_00,(Type)local_13e8,m_key_name_07,description_08,inner_07);
  RPCResult::RPCResult(&local_de8,&scan_result_abort);
  __l_04._M_len = 4;
  __l_04._M_array = &local_f80;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1910,__l_04,(allocator_type *)&local_1618);
  local_16b8._M_dataplus._M_p = (pointer)&local_16b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16b8,"scanblocks","");
  local_16d8._M_dataplus._M_p = (pointer)&local_16d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_16d8,
             "start \'[\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"]\' 300000","");
  HelpExampleCli(&local_1698,&local_16b8,&local_16d8);
  local_1718._M_dataplus._M_p = (pointer)&local_1718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1718,"scanblocks","");
  local_1738._M_dataplus._M_p = (pointer)&local_1738.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1738,
             "start \'[\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"]\' 100 150 basic","");
  HelpExampleCli(&local_16f8,&local_1718,&local_1738);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1698._M_dataplus._M_p != &local_1698.field_2) {
    uVar7 = local_1698.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_16f8._M_string_length + local_1698._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16f8._M_dataplus._M_p != &local_16f8.field_2) {
      uVar7 = local_16f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_16f8._M_string_length + local_1698._M_string_length) goto LAB_009d8fd8;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_16f8,0,0,local_1698._M_dataplus._M_p,local_1698._M_string_length);
  }
  else {
LAB_009d8fd8:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1698,local_16f8._M_dataplus._M_p,local_16f8._M_string_length);
  }
  local_1678._M_dataplus._M_p = (pointer)&local_1678.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if (paVar2 == paVar1) {
    local_1678.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1678.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_1678.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
  }
  else {
    local_1678.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1678._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1678._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_1778._M_dataplus._M_p = (pointer)&local_1778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1778,"scanblocks","");
  local_1798._M_dataplus._M_p = (pointer)&local_1798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1798,"status","");
  HelpExampleCli(&local_1758,&local_1778,&local_1798);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
    uVar7 = local_1678.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_1758._M_string_length + local_1678._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1758._M_dataplus._M_p != &local_1758.field_2) {
      uVar7 = local_1758.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1758._M_string_length + local_1678._M_string_length) goto LAB_009d9111;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1758,0,0,local_1678._M_dataplus._M_p,local_1678._M_string_length);
  }
  else {
LAB_009d9111:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1678,local_1758._M_dataplus._M_p,local_1758._M_string_length);
  }
  local_1658._M_dataplus._M_p = (pointer)&local_1658.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if (paVar2 == paVar1) {
    local_1658.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1658.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_1658.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
  }
  else {
    local_1658.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1658._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1658._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_17d8._M_dataplus._M_p = (pointer)&local_17d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_17d8,"scanblocks","");
  local_17f8._M_dataplus._M_p = (pointer)&local_17f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_17f8,
             "\"start\", [\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"], 300000","");
  HelpExampleRpc(&local_17b8,&local_17d8,&local_17f8);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1658._M_dataplus._M_p != &local_1658.field_2) {
    uVar7 = local_1658.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_17b8._M_string_length + local_1658._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_17b8._M_dataplus._M_p != &local_17b8.field_2) {
      uVar7 = local_17b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_17b8._M_string_length + local_1658._M_string_length) goto LAB_009d924a;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_17b8,0,0,local_1658._M_dataplus._M_p,local_1658._M_string_length);
  }
  else {
LAB_009d924a:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1658,local_17b8._M_dataplus._M_p,local_17b8._M_string_length);
  }
  local_1638._M_dataplus._M_p = (pointer)&local_1638.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if (paVar2 == paVar1) {
    local_1638.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1638.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_1638.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
  }
  else {
    local_1638.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1638._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1638._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_1838._M_dataplus._M_p = (pointer)&local_1838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1838,"scanblocks","");
  local_1858._M_dataplus._M_p = (pointer)&local_1858.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1858,
             "\"start\", [\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"], 100, 150, \"basic\""
             ,"");
  HelpExampleRpc(&local_1818,&local_1838,&local_1858);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1638._M_dataplus._M_p != &local_1638.field_2) {
    uVar7 = local_1638.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_1818._M_string_length + local_1638._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1818._M_dataplus._M_p != &local_1818.field_2) {
      uVar7 = local_1818.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1818._M_string_length + local_1638._M_string_length) goto LAB_009d9383;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1818,0,0,local_1638._M_dataplus._M_p,local_1638._M_string_length);
  }
  else {
LAB_009d9383:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1638,local_1818._M_dataplus._M_p,local_1818._M_string_length);
  }
  local_1618._M_dataplus._M_p = (pointer)&local_1618.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if (paVar2 == paVar1) {
    local_1618.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1618.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_1618.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
  }
  else {
    local_1618.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1618._M_dataplus._M_p = (pointer)paVar2;
  }
  local_1618._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_1898._M_dataplus._M_p = (pointer)&local_1898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1898,"scanblocks","");
  local_18b8._M_dataplus._M_p = (pointer)&local_18b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_18b8,"\"status\"","");
  HelpExampleRpc(&local_1878,&local_1898,&local_18b8);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1618._M_dataplus._M_p != &local_1618.field_2) {
    uVar7 = local_1618.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_1878._M_string_length + local_1618._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
      uVar7 = local_1878.field_2._M_allocated_capacity;
    }
    if (local_1878._M_string_length + local_1618._M_string_length <= (ulong)uVar7) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1878,0,0,local_1618._M_dataplus._M_p,local_1618._M_string_length);
      goto LAB_009d94e4;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1618,local_1878._M_dataplus._M_p,local_1878._M_string_length);
LAB_009d94e4:
  local_15f8 = &local_15e8;
  puVar3 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar1) {
    local_15e8 = paVar1->_M_allocated_capacity;
    uStack_15e0 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_15e8 = paVar1->_M_allocated_capacity;
    local_15f8 = puVar3;
  }
  local_15d0 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_15f8 == &local_15e8) {
    uStack_15c0 = uStack_15e0;
    local_15d8 = &local_15c8;
  }
  else {
    local_15d8 = local_15f8;
  }
  local_15c8 = local_15e8;
  local_15f0 = 0;
  local_15e8 = local_15e8 & 0xffffffffffffff00;
  pcVar10 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:2443:9)>
            ::_M_manager;
  name_04._8_16_ = in_stack_ffffffffffffe5a0;
  name_04._M_dataplus._M_p = &stack0xffffffffffffe5b8;
  name_04.field_2._8_8_ = in_RDI;
  description_06.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:2443:9)>
       ::_M_manager;
  description_06._M_dataplus._M_p = (pointer)0x0;
  description_06._M_string_length = 0;
  description_06.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:2443:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar11;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe5d8._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe5d8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar13;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe600;
  examples.m_examples._M_string_length = (size_type)pRVar15;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar14;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar16;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe620;
  local_15f8 = &local_15e8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_04,description_06,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar10 != (code *)0x0) {
    (*pcVar10)(&stack0xffffffffffffe5b8,&stack0xffffffffffffe5b8,3);
  }
  if (local_15d8 != &local_15c8) {
    operator_delete(local_15d8,local_15c8 + 1);
  }
  if (local_15f8 != &local_15e8) {
    operator_delete(local_15f8,local_15e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
    operator_delete(local_1878._M_dataplus._M_p,local_1878.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18b8._M_dataplus._M_p != &local_18b8.field_2) {
    operator_delete(local_18b8._M_dataplus._M_p,local_18b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1898._M_dataplus._M_p != &local_1898.field_2) {
    operator_delete(local_1898._M_dataplus._M_p,local_1898.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1618._M_dataplus._M_p != &local_1618.field_2) {
    operator_delete(local_1618._M_dataplus._M_p,local_1618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1818._M_dataplus._M_p != &local_1818.field_2) {
    operator_delete(local_1818._M_dataplus._M_p,local_1818.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1858._M_dataplus._M_p != &local_1858.field_2) {
    operator_delete(local_1858._M_dataplus._M_p,local_1858.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1838._M_dataplus._M_p != &local_1838.field_2) {
    operator_delete(local_1838._M_dataplus._M_p,local_1838.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1638._M_dataplus._M_p != &local_1638.field_2) {
    operator_delete(local_1638._M_dataplus._M_p,local_1638.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17b8._M_dataplus._M_p != &local_17b8.field_2) {
    operator_delete(local_17b8._M_dataplus._M_p,local_17b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17f8._M_dataplus._M_p != &local_17f8.field_2) {
    operator_delete(local_17f8._M_dataplus._M_p,local_17f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17d8._M_dataplus._M_p != &local_17d8.field_2) {
    operator_delete(local_17d8._M_dataplus._M_p,local_17d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1658._M_dataplus._M_p != &local_1658.field_2) {
    operator_delete(local_1658._M_dataplus._M_p,local_1658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._M_dataplus._M_p != &local_1758.field_2) {
    operator_delete(local_1758._M_dataplus._M_p,local_1758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1798._M_dataplus._M_p != &local_1798.field_2) {
    operator_delete(local_1798._M_dataplus._M_p,local_1798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1778._M_dataplus._M_p != &local_1778.field_2) {
    operator_delete(local_1778._M_dataplus._M_p,local_1778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
    operator_delete(local_1678._M_dataplus._M_p,local_1678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16f8._M_dataplus._M_p != &local_16f8.field_2) {
    operator_delete(local_16f8._M_dataplus._M_p,local_16f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._M_dataplus._M_p != &local_1738.field_2) {
    operator_delete(local_1738._M_dataplus._M_p,local_1738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1718._M_dataplus._M_p != &local_1718.field_2) {
    operator_delete(local_1718._M_dataplus._M_p,local_1718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1698._M_dataplus._M_p != &local_1698.field_2) {
    operator_delete(local_1698._M_dataplus._M_p,local_1698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
    operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16b8._M_dataplus._M_p != &local_16b8.field_2) {
    operator_delete(local_16b8._M_dataplus._M_p,local_16b8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1910);
  lVar8 = 0x220;
  do {
    if ((long *)((long)local_f90 + lVar8) != *(long **)((long)local_fa0 + lVar8)) {
      operator_delete(*(long **)((long)local_fa0 + lVar8),*(long *)((long)local_f90 + lVar8) + 1);
    }
    if ((long *)((long)local_fb0 + lVar8) != *(long **)((long)local_fc0 + lVar8)) {
      operator_delete(*(long **)((long)local_fc0 + lVar8),*(long *)((long)local_fb0 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar8));
    plVar4 = *(long **)((long)&local_1068.m_cond._M_dataplus._M_p + lVar8);
    plVar6 = (long *)(local_1068.m_cond.field_2._M_local_buf + lVar8);
    if (plVar6 != plVar4) {
      operator_delete(plVar4,*plVar6 + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe628);
  lVar8 = 0x110;
  do {
    if ((long *)(local_1548 + lVar8) != *(long **)((long)local_1558 + lVar8)) {
      operator_delete(*(long **)((long)local_1558 + lVar8),*(long *)(local_1548 + lVar8) + 1);
    }
    if ((long *)((long)local_1568 + lVar8) != *(long **)((long)local_1578 + lVar8)) {
      operator_delete(*(long **)((long)local_1578 + lVar8),*(long *)((long)local_1568 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar8));
    if ((long *)((long)local_15a8 + lVar8) != *(long **)((long)local_15b8 + lVar8)) {
      operator_delete(*(long **)((long)local_15b8 + lVar8),*(long *)((long)local_15a8 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe5e8);
  if (local_15b8[0] != local_15a8) {
    operator_delete(local_15b8[0],local_15a8[0] + 1);
  }
  if (local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1598.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe608);
  if (local_1578[0] != local_1568) {
    operator_delete(local_1578[0],local_1568[0] + 1);
  }
  if (local_1558[0] != (pointer)local_1548) {
    operator_delete(local_1558[0],local_1548._0_8_ + 1);
  }
  if (local_1428[0] != local_1418) {
    operator_delete(local_1428[0],local_1418[0] + 1);
  }
  if (local_1408[0] != local_13f8) {
    operator_delete(local_1408[0],local_13f8[0] + 1);
  }
  if (local_13e8[0] != local_13d8) {
    operator_delete(local_13e8[0],local_13d8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1928);
  lVar8 = 0x220;
  do {
    if ((long *)(local_1210 + lVar8) != *(long **)((long)local_1220 + lVar8)) {
      operator_delete(*(long **)((long)local_1220 + lVar8),*(long *)(local_1210 + lVar8) + 1);
    }
    if ((long *)((long)local_1230 + lVar8) != *(long **)((long)local_1240 + lVar8)) {
      operator_delete(*(long **)((long)local_1240 + lVar8),*(long *)((long)local_1230 + lVar8) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1260.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar8));
    if ((long *)((long)local_1270 + lVar8) != *(long **)((long)local_1280 + lVar8)) {
      operator_delete(*(long **)((long)local_1280 + lVar8),*(long *)((long)local_1270 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe648);
  if (local_13c8[0] != local_13b8) {
    operator_delete(local_13c8[0],local_13b8[0] + 1);
  }
  if (local_13a8[0] != local_1398) {
    operator_delete(local_13a8[0],local_1398[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1980);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1348.m_cond._M_dataplus._M_p != &local_1348.m_cond.field_2) {
    operator_delete(local_1348.m_cond._M_dataplus._M_p,
                    local_1348.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1348.m_description._M_dataplus._M_p != &local_1348.m_description.field_2) {
    operator_delete(local_1348.m_description._M_dataplus._M_p,
                    local_1348.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1348.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1348.m_key_name._M_dataplus._M_p != &local_1348.m_key_name.field_2) {
    operator_delete(local_1348.m_key_name._M_dataplus._M_p,
                    local_1348.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe668);
  if (local_1388[0] != local_1378) {
    operator_delete(local_1388[0],local_1378[0] + 1);
  }
  if (local_1368[0] != local_1358) {
    operator_delete(local_1368[0],local_1358[0] + 1);
  }
  if (local_12c0[0] != local_12b0) {
    operator_delete(local_12c0[0],local_12b0[0] + 1);
  }
  if (local_12a0[0] != local_1290) {
    operator_delete(local_12a0[0],local_1290[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1968);
  if (local_1280[0] != local_1270) {
    operator_delete(local_1280[0],local_1270[0] + 1);
  }
  if (local_1260.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1260.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1260.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1260.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1948);
  if (local_1240[0] != local_1230) {
    operator_delete(local_1240[0],local_1230[0] + 1);
  }
  if (local_1220[0] != (pointer)local_1210) {
    operator_delete(local_1220[0],local_1210._0_8_ + 1);
  }
  if (local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_fe0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  if (local_fc0[0] != local_fb0) {
    operator_delete(local_fc0[0],local_fb0[0] + 1);
  }
  if (local_fa0[0] != local_f90) {
    operator_delete(local_fa0[0],local_f90[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_18d0);
  lVar8 = 0x630;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_6c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar8));
    if ((long *)(local_728 + lVar8 + 0x50) != *(long **)(local_728 + lVar8 + 0x40)) {
      operator_delete(*(long **)(local_728 + lVar8 + 0x40),*(long *)(local_728 + lVar8 + 0x50) + 1);
    }
    if ((long *)(local_728 + lVar8 + 0x28) != *(long **)(local_728 + lVar8 + 0x18)) {
      operator_delete(*(long **)(local_728 + lVar8 + 0x18),*(long *)(local_728 + lVar8 + 0x28) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_780 + lVar8 + 0x10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(auStack_788 + lVar8));
    if ((long *)((long)local_7a0 + lVar8) != *(long **)(local_7c0 + lVar8 + 0x10)) {
      operator_delete(*(long **)(local_7c0 + lVar8 + 0x10),*(long *)((long)local_7a0 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d38);
  if (local_d58[0] != local_d48) {
    operator_delete(local_d58[0],local_d48[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_18f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_bd8.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8.m_opts.oneline_description._M_dataplus._M_p !=
      &local_bd8.m_opts.oneline_description.field_2) {
    operator_delete(local_bd8.m_opts.oneline_description._M_dataplus._M_p,
                    local_bd8.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8.m_description._M_dataplus._M_p != &local_bd8.m_description.field_2) {
    operator_delete(local_bd8.m_description._M_dataplus._M_p,
                    local_bd8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_bd8.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_bd8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8.m_names._M_dataplus._M_p != &local_bd8.m_names.field_2) {
    operator_delete(local_bd8.m_names._M_dataplus._M_p,
                    local_bd8.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_cf0);
  if (local_d10 != &local_d00) {
    operator_delete(local_d10,CONCAT71(uStack_cff,local_d00) + 1);
  }
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_c58._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_cb0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_cb0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0.val._M_dataplus._M_p != &local_cb0.val.field_2) {
    operator_delete(local_cb0.val._M_dataplus._M_p,
                    CONCAT71(local_cb0.val.field_2._M_allocated_capacity._1_7_,
                             local_cb0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_bf8[0] != local_be8) {
    operator_delete(local_bf8[0],local_be8[0] + 1);
  }
  if (local_ad0[0] != local_ac0) {
    operator_delete(local_ad0[0],local_ac0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_ab0._M_first);
  if (local_a50[0] != local_a40) {
    operator_delete(local_a50[0],local_a40[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a08);
  if (local_a28 != &local_a18) {
    operator_delete(local_a28,CONCAT71(uStack_a17,local_a18) + 1);
  }
  if (local_9e8[0] != local_9d8) {
    operator_delete(local_9e8[0],local_9d8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_970._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_9c8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9c8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8.val._M_dataplus._M_p != &local_9c8.val.field_2) {
    operator_delete(local_9c8.val._M_dataplus._M_p,
                    CONCAT71(local_9c8.val.field_2._M_allocated_capacity._1_7_,
                             local_9c8.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_910[0] != local_900) {
    operator_delete(local_910[0],local_900[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c8);
  if (local_8e8 != &local_8d8) {
    operator_delete(local_8e8,CONCAT71(uStack_8d7,local_8d8) + 1);
  }
  if (local_8a8[0] != local_898) {
    operator_delete(local_8a8[0],local_898[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_868._M_first);
  if (local_888 != &local_878) {
    operator_delete(local_888,CONCAT44(uStack_874,local_878) + 1);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7c0);
  if (local_7e0 != &local_7d0) {
    operator_delete(local_7e0,CONCAT71(uStack_7cf,local_7d0) + 1);
  }
  if (local_7a0[0] != &local_790) {
    operator_delete(local_7a0[0],local_790 + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_728);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_740);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_758);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._8_8_ != &local_768) {
    operator_delete((void *)local_780._8_8_,
                    CONCAT71(local_768._M_allocated_capacity._1_7_,local_768._M_local_buf[0]) + 1);
  }
  if (local_6c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_6c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_6c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_6c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan scanblocks()
{
    return RPCHelpMan{"scanblocks",
        "\nReturn relevant blockhashes for given descriptors (requires blockfilterindex).\n"
        "This call may take several minutes. Make sure to use no RPC timeout (bitcoin-cli -rpcclienttimeout=0)",
        {
            scan_action_arg_desc,
            scan_objects_arg_desc,
            RPCArg{"start_height", RPCArg::Type::NUM, RPCArg::Default{0}, "Height to start to scan from"},
            RPCArg{"stop_height", RPCArg::Type::NUM, RPCArg::DefaultHint{"chain tip"}, "Height to stop to scan"},
            RPCArg{"filtertype", RPCArg::Type::STR, RPCArg::Default{BlockFilterTypeName(BlockFilterType::BASIC)}, "The type name of the filter"},
            RPCArg{"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                {
                    {"filter_false_positives", RPCArg::Type::BOOL, RPCArg::Default{false}, "Filter false positives (slower and may fail on pruned nodes). Otherwise they may occur at a rate of 1/M"},
                },
                RPCArgOptions{.oneline_description="options"}},
        },
        {
            scan_result_status_none,
            RPCResult{"When action=='start'; only returns after scan completes", RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::NUM, "from_height", "The height we started the scan from"},
                {RPCResult::Type::NUM, "to_height", "The height we ended the scan at"},
                {RPCResult::Type::ARR, "relevant_blocks", "Blocks that may have matched a scanobject.", {
                    {RPCResult::Type::STR_HEX, "blockhash", "A relevant blockhash"},
                }},
                {RPCResult::Type::BOOL, "completed", "true if the scan process was not aborted"}
            }},
            RPCResult{"when action=='status' and a scan is currently in progress", RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::NUM, "progress", "Approximate percent complete"},
                    {RPCResult::Type::NUM, "current_height", "Height of the block currently being scanned"},
                },
            },
            scan_result_abort,
        },
        RPCExamples{
            HelpExampleCli("scanblocks", "start '[\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"]' 300000") +
            HelpExampleCli("scanblocks", "start '[\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"]' 100 150 basic") +
            HelpExampleCli("scanblocks", "status") +
            HelpExampleRpc("scanblocks", "\"start\", [\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"], 300000") +
            HelpExampleRpc("scanblocks", "\"start\", [\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"], 100, 150, \"basic\"") +
            HelpExampleRpc("scanblocks", "\"status\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue ret(UniValue::VOBJ);
    if (request.params[0].get_str() == "status") {
        BlockFiltersScanReserver reserver;
        if (reserver.reserve()) {
            // no scan in progress
            return NullUniValue;
        }
        ret.pushKV("progress", g_scanfilter_progress.load());
        ret.pushKV("current_height", g_scanfilter_progress_height.load());
        return ret;
    } else if (request.params[0].get_str() == "abort") {
        BlockFiltersScanReserver reserver;
        if (reserver.reserve()) {
            // reserve was possible which means no scan was running
            return false;
        }
        // set the abort flag
        g_scanfilter_should_abort_scan = true;
        return true;
    } else if (request.params[0].get_str() == "start") {
        BlockFiltersScanReserver reserver;
        if (!reserver.reserve()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Scan already in progress, use action \"abort\" or \"status\"");
        }
        const std::string filtertype_name{request.params[4].isNull() ? "basic" : request.params[4].get_str()};

        BlockFilterType filtertype;
        if (!BlockFilterTypeByName(filtertype_name, filtertype)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Unknown filtertype");
        }

        UniValue options{request.params[5].isNull() ? UniValue::VOBJ : request.params[5]};
        bool filter_false_positives{options.exists("filter_false_positives") ? options["filter_false_positives"].get_bool() : false};

        BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
        if (!index) {
            throw JSONRPCError(RPC_MISC_ERROR, "Index is not enabled for filtertype " + filtertype_name);
        }

        NodeContext& node = EnsureAnyNodeContext(request.context);
        ChainstateManager& chainman = EnsureChainman(node);

        // set the start-height
        const CBlockIndex* start_index = nullptr;
        const CBlockIndex* stop_block = nullptr;
        {
            LOCK(cs_main);
            CChain& active_chain = chainman.ActiveChain();
            start_index = active_chain.Genesis();
            stop_block = active_chain.Tip(); // If no stop block is provided, stop at the chain tip.
            if (!request.params[2].isNull()) {
                start_index = active_chain[request.params[2].getInt<int>()];
                if (!start_index) {
                    throw JSONRPCError(RPC_MISC_ERROR, "Invalid start_height");
                }
            }
            if (!request.params[3].isNull()) {
                stop_block = active_chain[request.params[3].getInt<int>()];
                if (!stop_block || stop_block->nHeight < start_index->nHeight) {
                    throw JSONRPCError(RPC_MISC_ERROR, "Invalid stop_height");
                }
            }
        }
        CHECK_NONFATAL(start_index);
        CHECK_NONFATAL(stop_block);

        // loop through the scan objects, add scripts to the needle_set
        GCSFilter::ElementSet needle_set;
        for (const UniValue& scanobject : request.params[1].get_array().getValues()) {
            FlatSigningProvider provider;
            std::vector<CScript> scripts = EvalDescriptorStringOrObject(scanobject, provider);
            for (const CScript& script : scripts) {
                needle_set.emplace(script.begin(), script.end());
            }
        }
        UniValue blocks(UniValue::VARR);
        const int amount_per_chunk = 10000;
        std::vector<BlockFilter> filters;
        int start_block_height = start_index->nHeight; // for progress reporting
        const int total_blocks_to_process = stop_block->nHeight - start_block_height;

        g_scanfilter_should_abort_scan = false;
        g_scanfilter_progress = 0;
        g_scanfilter_progress_height = start_block_height;
        bool completed = true;

        const CBlockIndex* end_range = nullptr;
        do {
            node.rpc_interruption_point(); // allow a clean shutdown
            if (g_scanfilter_should_abort_scan) {
                completed = false;
                break;
            }

            // split the lookup range in chunks if we are deeper than 'amount_per_chunk' blocks from the stopping block
            int start_block = !end_range ? start_index->nHeight : start_index->nHeight + 1; // to not include the previous round 'end_range' block
            end_range = (start_block + amount_per_chunk < stop_block->nHeight) ?
                    WITH_LOCK(::cs_main, return chainman.ActiveChain()[start_block + amount_per_chunk]) :
                    stop_block;

            if (index->LookupFilterRange(start_block, end_range, filters)) {
                for (const BlockFilter& filter : filters) {
                    // compare the elements-set with each filter
                    if (filter.GetFilter().MatchAny(needle_set)) {
                        if (filter_false_positives) {
                            // Double check the filter matches by scanning the block
                            const CBlockIndex& blockindex = *CHECK_NONFATAL(WITH_LOCK(cs_main, return chainman.m_blockman.LookupBlockIndex(filter.GetBlockHash())));

                            if (!CheckBlockFilterMatches(chainman.m_blockman, blockindex, needle_set)) {
                                continue;
                            }
                        }

                        blocks.push_back(filter.GetBlockHash().GetHex());
                    }
                }
            }
            start_index = end_range;

            // update progress
            int blocks_processed = end_range->nHeight - start_block_height;
            if (total_blocks_to_process > 0) { // avoid division by zero
                g_scanfilter_progress = (int)(100.0 / total_blocks_to_process * blocks_processed);
            } else {
                g_scanfilter_progress = 100;
            }
            g_scanfilter_progress_height = end_range->nHeight;

        // Finish if we reached the stop block
        } while (start_index != stop_block);

        ret.pushKV("from_height", start_block_height);
        ret.pushKV("to_height", start_index->nHeight); // start_index is always the last scanned block here
        ret.pushKV("relevant_blocks", std::move(blocks));
        ret.pushKV("completed", completed);
    }
    else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid action '%s'", request.params[0].get_str()));
    }
    return ret;
},
    };
}